

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_freetable(void **argtable,size_t n)

{
  arg_hdr **table;
  size_t sVar1;
  
  if (n != 0) {
    sVar1 = 0;
    do {
      if (argtable[sVar1] != (void *)0x0) {
        free(argtable[sVar1]);
        argtable[sVar1] = (void *)0x0;
      }
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
  }
  return;
}

Assistant:

void arg_freetable(void * *argtable, size_t n) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	size_t tabindex = 0;

	/*printf("arg_freetable(%p)\n",argtable);*/
	for (tabindex = 0; tabindex < n; tabindex++) {
		if (table[tabindex] == NULL) {
			continue;
		}

		free(table[tabindex]);
		table[tabindex] = NULL;
	};
}